

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_do(connectdata **connp,_Bool *done)

{
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var1;
  SessionHandle *pSVar2;
  CURLcode CVar3;
  int iVar4;
  connectdata *pcVar5;
  
  pcVar5 = *connp;
  p_Var1 = pcVar5->handler->do_it;
  if (p_Var1 != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
    pSVar2 = pcVar5->data;
    CVar3 = (*p_Var1)(pcVar5,done);
    if (CVar3 == CURLE_SEND_ERROR) {
      if ((pcVar5->bits).reuse != true) {
        return CURLE_SEND_ERROR;
      }
      if (pSVar2->multi != (Curl_multi *)0x0) {
        return CURLE_SEND_ERROR;
      }
      CVar3 = Curl_reconnect_request(connp);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar5 = *connp;
      CVar3 = (*pcVar5->handler->do_it)(pcVar5,done);
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done == true) {
      pSVar2 = pcVar5->data;
      (pSVar2->req).chunk = false;
      iVar4 = pcVar5->writesockfd;
      if (pcVar5->writesockfd < pcVar5->sockfd) {
        iVar4 = pcVar5->sockfd;
      }
      (pSVar2->req).maxfd = iVar4 + 1;
      Curl_pgrsTime(pSVar2,TIMER_PRETRANSFER);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_do(struct connectdata **connp, bool *done)
{
  CURLcode result=CURLE_OK;
  struct connectdata *conn = *connp;
  struct SessionHandle *data = conn->data;

  if(conn->handler->do_it) {
    /* generic protocol-specific function pointer set in curl_connect() */
    result = conn->handler->do_it(conn, done);

    /* This was formerly done in transfer.c, but we better do it here */
    if((CURLE_SEND_ERROR == result) && conn->bits.reuse) {
      /*
       * If the connection is using an easy handle, call reconnect
       * to re-establish the connection.  Otherwise, let the multi logic
       * figure out how to re-establish the connection.
       */
      if(!data->multi) {
        result = Curl_reconnect_request(connp);

        if(result == CURLE_OK) {
          /* ... finally back to actually retry the DO phase */
          conn = *connp; /* re-assign conn since Curl_reconnect_request
                            creates a new connection */
          result = conn->handler->do_it(conn, done);
        }
      }
      else
        return result;
    }

    if((result == CURLE_OK) && *done)
      /* do_complete must be called after the protocol-specific DO function */
      do_complete(conn);
  }
  return result;
}